

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFieldTypesTests::TestDateTime_convertToNanos::TestDateTime_convertToNanos
          (TestDateTime_convertToNanos *this)

{
  char *suiteName;
  TestDateTime_convertToNanos *this_local;
  
  suiteName = SuiteFieldTypesTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"DateTime_convertToNanos",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/FieldTypesTestCase.cpp"
             ,0x35);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestDateTime_convertToNanos_00457f30;
  return;
}

Assistant:

TEST(DateTime_convertToNanos)
{

  CHECK_EQUAL(1000000000,FIX::DateTime::convertToNanos(1,0));
  CHECK_EQUAL(100000000,FIX::DateTime::convertToNanos(1,1));
  CHECK_EQUAL(10000000,FIX::DateTime::convertToNanos(1,2));
  CHECK_EQUAL(1000000,FIX::DateTime::convertToNanos(1,3));
  CHECK_EQUAL(100000,FIX::DateTime::convertToNanos(1,4));
  CHECK_EQUAL(10000,FIX::DateTime::convertToNanos(1,5));
  CHECK_EQUAL(1000,FIX::DateTime::convertToNanos(1,6));
  CHECK_EQUAL(100,FIX::DateTime::convertToNanos(1,7));
  CHECK_EQUAL(10,FIX::DateTime::convertToNanos(1,8));
  CHECK_EQUAL(1,FIX::DateTime::convertToNanos(1,9));
  CHECK_EQUAL(1,FIX::DateTime::convertToNanos(1,25));

}